

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_layout.cc
# Opt level: O1

vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *
upb::generator::FieldNumberOrder
          (vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *__return_storage_ptr__,
          MessageDefPtr message)

{
  pointer pFVar1;
  pointer pFVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int i;
  __normal_iterator<upb::FieldDefPtr_*,_std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>_>
  __i;
  pointer pFVar7;
  FieldDefPtr local_30;
  
  (__return_storage_ptr__->super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = upb_MessageDef_FieldCount(message.ptr_);
  std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::reserve
            (__return_storage_ptr__,(long)iVar4);
  iVar4 = 0;
  while( true ) {
    iVar5 = upb_MessageDef_FieldCount(message.ptr_);
    if (iVar5 <= iVar4) break;
    local_30.ptr_ = upb_MessageDef_Field(message.ptr_,iVar4);
    std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::emplace_back<upb::FieldDefPtr>
              (__return_storage_ptr__,&local_30);
    iVar4 = iVar4 + 1;
  }
  pFVar1 = (__return_storage_ptr__->
           super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pFVar2 = (__return_storage_ptr__->
           super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pFVar1 != pFVar2) {
    uVar6 = (long)pFVar2 - (long)pFVar1 >> 3;
    lVar3 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<upb::FieldDefPtr*,std::vector<upb::FieldDefPtr,std::allocator<upb::FieldDefPtr>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<upb::generator::FieldNumberOrder(upb::MessageDefPtr)::__0>>
              (pFVar1,pFVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pFVar2 - (long)pFVar1 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<upb::FieldDefPtr*,std::vector<upb::FieldDefPtr,std::allocator<upb::FieldDefPtr>>>,__gnu_cxx::__ops::_Iter_comp_iter<upb::generator::FieldNumberOrder(upb::MessageDefPtr)::__0>>
                (pFVar1,pFVar2);
    }
    else {
      pFVar7 = pFVar1 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<upb::FieldDefPtr*,std::vector<upb::FieldDefPtr,std::allocator<upb::FieldDefPtr>>>,__gnu_cxx::__ops::_Iter_comp_iter<upb::generator::FieldNumberOrder(upb::MessageDefPtr)::__0>>
                (pFVar1,pFVar7);
      for (; pFVar7 != pFVar2; pFVar7 = pFVar7 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<upb::FieldDefPtr*,std::vector<upb::FieldDefPtr,std::allocator<upb::FieldDefPtr>>>,__gnu_cxx::__ops::_Val_comp_iter<upb::generator::FieldNumberOrder(upb::MessageDefPtr)::__0>>
                  (pFVar7);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<upb::FieldDefPtr> FieldNumberOrder(upb::MessageDefPtr message) {
  std::vector<upb::FieldDefPtr> fields;
  fields.reserve(message.field_count());
  for (int i = 0; i < message.field_count(); i++) {
    fields.push_back(message.field(i));
  }
  std::sort(fields.begin(), fields.end(),
            [](upb::FieldDefPtr a, upb::FieldDefPtr b) {
              return a.number() < b.number();
            });
  return fields;
}